

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_connect(_glist *x,t_floatarg fwhoout,t_floatarg foutno,t_floatarg fwhoin,
                   t_floatarg finno)

{
  uint uVar1;
  int iVar2;
  t_object *ob1;
  t_object *ob2;
  _outconnect *p_Var3;
  undefined4 extraout_var;
  _glist *p_Var4;
  uint uVar5;
  uint n2;
  char *pcVar6;
  _gobj *x_00;
  uint uVar7;
  t_gobj *ptVar8;
  char *pcVar9;
  _gobj *x_01;
  uint n1;
  char *pcVar10;
  uint uVar11;
  char *tags [2];
  char tag [128];
  
  uVar11 = (uint)fwhoout;
  uVar7 = (uint)fwhoin;
  uVar1 = uVar7;
  uVar5 = uVar11;
  if (*(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x70) == x) {
    iVar2 = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x68);
    uVar5 = iVar2 + uVar11;
    uVar1 = iVar2 + uVar7;
  }
  n1 = (uint)foutno;
  n2 = (uint)finno;
  x_00 = x->gl_list;
  x_01 = x_00;
  for (; uVar5 != 0; uVar5 = uVar5 - 1) {
    x_01 = x_01->g_next;
    if (x_01 == (_gobj *)0x0) {
      x_00 = (t_gobj *)0x0;
      logpost((void *)0x0,3,"cannot connect non-existing object");
      x_01 = (t_gobj *)0x0;
      goto LAB_0013cf40;
    }
  }
  for (; ptVar8 = x_01, uVar1 != 0; uVar1 = uVar1 - 1) {
    x_00 = x_00->g_next;
    if (x_00 == (_gobj *)0x0) {
      pcVar6 = "cannot connect to non-existing object";
      x_00 = (t_gobj *)0x0;
      goto LAB_0013cf34;
    }
  }
  ob1 = pd_checkobject(&x_01->g_pd);
  if ((ob1 == (t_object *)0x0) || (ob2 = pd_checkobject(&x_00->g_pd), ob2 == (t_object *)0x0)) {
    if (x_01 == (t_gobj *)0x0) {
      ptVar8 = x_00;
    }
    pcVar6 = "cannot connect unpatchable object";
  }
  else {
    iVar2 = canvas_isconnected(x,ob1,n1,ob2,n2);
    if (iVar2 == 0) {
      if ((x_01->g_pd == text_class) && ((ob1->field_0x2e & 3) == 1)) {
        while (iVar2 = obj_noutlets(ob1), iVar2 <= (int)n1) {
          outlet_new(ob1,(t_symbol *)0x0);
        }
      }
      if ((x_00->g_pd == text_class) && ((ob2->field_0x2e & 3) == 1)) {
        while (iVar2 = obj_ninlets(ob2), iVar2 <= (int)n2) {
          inlet_new(ob2,(t_pd *)ob2,(t_symbol *)0x0,(t_symbol *)0x0);
        }
      }
      p_Var3 = obj_connect(ob1,n1,ob2,n2);
      if (p_Var3 != (_outconnect *)0x0) {
        iVar2 = glist_isvisible(x);
        if (iVar2 == 0) {
          return;
        }
        if ((x->field_0xe8 & 1) == 0) {
          return;
        }
        tags[0] = tag;
        tags[1] = "cord";
        iVar2 = sprintf(tags[0],"l%lx",p_Var3);
        p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
        iVar2 = obj_issignaloutlet(ob1,n1);
        pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var4,"create","line",0,0,0,0,"-width",
                    (ulong)(uint)(x->gl_zoom << (iVar2 != 0)),"-tags",2,tags);
        canvas_fixlinesfor(x,ob1);
        return;
      }
      goto LAB_0013cf40;
    }
    pcVar6 = "io pair already connected";
  }
LAB_0013cf34:
  logpost(ptVar8,3,pcVar6);
LAB_0013cf40:
  pcVar6 = x->gl_name->s_name;
  pcVar9 = "???";
  pcVar10 = "???";
  if (x_01 != (t_gobj *)0x0) {
    pcVar10 = class_getname(x_01->g_pd);
  }
  if (x_00 != (t_gobj *)0x0) {
    pcVar9 = class_getname(x_00->g_pd);
  }
  post("%s %d %d %d %d (%s->%s) connection failed",pcVar6,(ulong)uVar11,(ulong)n1,(ulong)uVar7,
       (ulong)n2,pcVar10,pcVar9);
  return;
}

Assistant:

void canvas_connect(t_canvas *x, t_floatarg fwhoout, t_floatarg foutno,
    t_floatarg fwhoin, t_floatarg finno)
{
    int whoout = fwhoout, outno = foutno, whoin = fwhoin, inno = finno;
    t_gobj *src = 0, *sink = 0;
    t_object *objsrc, *objsink;
    t_outconnect *oc;
    int nin = whoin, nout = whoout;
    if (EDITOR->paste_canvas == x) whoout += EDITOR->paste_onset,
        whoin += EDITOR->paste_onset;
    for (src = x->gl_list; whoout; src = src->g_next, whoout--)
        if (!src->g_next) {
            src = NULL;
            logpost(sink, 3, "cannot connect non-existing object");
            goto bad; /* bug fix thanks to Hannes */
        }
    for (sink = x->gl_list; whoin; sink = sink->g_next, whoin--)
        if (!sink->g_next) {
            sink = NULL;
            logpost(src, 3, "cannot connect to non-existing object");
            goto bad;
        }

        /* check they're both patchable objects */
    if (!(objsrc = pd_checkobject(&src->g_pd)) ||
        !(objsink = pd_checkobject(&sink->g_pd))) {
        logpost(src?src:sink, 3, "cannot connect unpatchable object");
        goto bad;
    }

        /* check if objects are already connected */
    if (canvas_isconnected(x, objsrc, outno, objsink, inno)) {
        logpost(src, 3, "io pair already connected");
        goto bad;
    }

        /* if object creation failed, make dummy inlets or outlets
           as needed */
    if (pd_class(&src->g_pd) == text_class && objsrc->te_type == T_OBJECT)
        while (outno >= obj_noutlets(objsrc))
            outlet_new(objsrc, 0);
    if (pd_class(&sink->g_pd) == text_class && objsink->te_type == T_OBJECT)
        while (inno >= obj_ninlets(objsink))
            inlet_new(objsink, &objsink->ob_pd, 0, 0);

    if (!(oc = obj_connect(objsrc, outno, objsink, inno))) goto bad;
    if (glist_isvisible(x) && x->gl_havewindow)
    {
        char tag[128];
        char*tags[] = {tag, "cord"};
        sprintf(tag, "l%lx", oc);
        pdgui_vmess(0, "crr iiii ri rS",
            glist_getcanvas(x), "create", "line",
            0, 0, 0, 0,
            "-width", (obj_issignaloutlet(objsrc, outno) ? 2 : 1) * x->gl_zoom,
            "-tags", 2, tags);
        canvas_fixlinesfor(x, objsrc);
    }
    return;

bad:
    post("%s %d %d %d %d (%s->%s) connection failed",
        x->gl_name->s_name, nout, outno, nin, inno,
            (src? class_getname(pd_class(&src->g_pd)) : "???"),
            (sink? class_getname(pd_class(&sink->g_pd)) : "???"));
}